

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O3

Vector<float,_4> __thiscall
rr::readTriangleVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  GenericVec4 *pGVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  GenericVec4 GVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<float,_4> *res;
  Vector<float,_4> VVar11;
  
  pGVar1 = context->varyings[0] + varyingLoc;
  fVar6 = (pGVar1->v).fData[2];
  fVar7 = (pGVar1->v).fData[3];
  fVar2 = packet->barycentric[0].m_data[fragNdx];
  fVar3 = packet->barycentric[1].m_data[fragNdx];
  fVar4 = packet->barycentric[2].m_data[fragNdx];
  VVar11.m_data[2] = fVar2 * (pGVar1->v).fData[0];
  VVar11.m_data[3] = fVar2 * (pGVar1->v).fData[1];
  pGVar1 = context->varyings[1] + varyingLoc;
  fVar8 = (pGVar1->v).fData[1];
  fVar9 = (pGVar1->v).fData[2];
  fVar10 = (pGVar1->v).fData[3];
  GVar5.v = *(anon_union_16_3_1194ccdc_for_v *)context->varyings[2][varyingLoc].v.uData;
  VVar11.m_data._0_8_ = GVar5.v._0_8_;
  *(float *)this = fVar4 * GVar5.v._0_4_ + fVar3 * (pGVar1->v).fData[0] + VVar11.m_data[2];
  *(float *)(this + 4) = fVar4 * GVar5.v._4_4_ + fVar3 * fVar8 + VVar11.m_data[3];
  *(float *)(this + 8) = fVar4 * GVar5.v._8_4_ + fVar3 * fVar9 + fVar2 * fVar6;
  *(float *)(this + 0xc) = fVar4 * GVar5.v._12_4_ + fVar3 * fVar10 + fVar2 * fVar7;
  return (Vector<float,_4>)VVar11.m_data;
}

Assistant:

tcu::Vector<T, 4> readTriangleVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	return   packet.barycentric[0][fragNdx] * context.varyings[0][varyingLoc].get<T>()
		   + packet.barycentric[1][fragNdx] * context.varyings[1][varyingLoc].get<T>()
		   + packet.barycentric[2][fragNdx] * context.varyings[2][varyingLoc].get<T>();
}